

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::stuff_text(CTcTokenizer *this,char *txt,size_t len,int expand)

{
  CTcTokString *pCVar1;
  ulong uVar2;
  CTcTokString expbuf;
  CTcTokString local_58;
  CTcTokString local_38;
  
  local_58._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_0031ca78;
  local_58.buf_ = (char *)0x0;
  local_58.buf_size_ = 0;
  local_58.buf_len_ = 0;
  if (expand != 0) {
    local_38._vptr_CTcTokString = (_func_int **)&PTR__CTcTokStringRef_0031ccf8;
    local_38.buf_size_ = len + 1;
    local_38.buf_ = txt;
    local_38.buf_len_ = len;
    expand_macros(this,&local_38,(utf8_ptr *)0x0,&local_58,0,0,0);
    len = local_58.buf_len_;
    txt = local_58.buf_;
  }
  pCVar1 = this->curbuf_;
  uVar2 = (long)(this->p_).p_ - (long)pCVar1->buf_;
  (*pCVar1->_vptr_CTcTokString[7])(pCVar1,uVar2 & 0xffffffff,txt,len);
  (this->p_).p_ = this->curbuf_->buf_ + (int)uVar2;
  local_58._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_0031ca78;
  if (local_58.buf_ != (char *)0x0) {
    free(local_58.buf_);
  }
  return;
}

Assistant:

void CTcTokenizer::stuff_text(const char *txt, size_t len, int expand)
{
    CTcTokString expbuf;
    int p_ofs;
    
    /* if desired, expand macros */
    if (expand)
    {
        /* expand macros in the text, storing the result in 'expbuf' */
        expand_macros(&expbuf, txt, len);

        /* use the expanded version as the stuffed text now */
        txt = expbuf.get_text();
        len = expbuf.get_text_len();
    }

    /* get the current p_ offset */
    p_ofs = p_.getptr() - curbuf_->get_text();

    /* insert the text into the buffer */
    curbuf_->insert(p_ofs, txt, len);

    /* reset p_ in case the curbuf_ buffer was reallocated for expansion */
    start_new_line(curbuf_, p_ofs);
}